

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

int ompt_get_partition_place_nums(int place_nums_size,int *place_nums)

{
  int iVar1;
  kmp_info_t *pkVar2;
  long in_RSI;
  int in_EDI;
  kmp_info_t *thread;
  int end;
  int start;
  int last_place;
  int first_place;
  int place_num;
  int gtid;
  int i;
  int local_2c;
  int local_28;
  int local_1c;
  int local_14;
  int local_4;
  
  if ((((ulong)ompt_enabled & 1) == 0) || (iVar1 = __kmp_get_global_thread_id(), iVar1 < 0)) {
    local_4 = 0;
  }
  else if (__kmp_affin_mask_size == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = __kmp_get_global_thread_id_reg();
    pkVar2 = __kmp_thread_from_gtid(iVar1);
    if (pkVar2 == (kmp_info_t *)0x0) {
      local_4 = 0;
    }
    else {
      iVar1 = (pkVar2->th).th_first_place;
      local_28 = (pkVar2->th).th_last_place;
      if ((iVar1 < 0) || (local_28 < 0)) {
        local_4 = 0;
      }
      else {
        local_2c = iVar1;
        if (iVar1 <= local_28) {
          local_2c = local_28;
          local_28 = iVar1;
        }
        if (local_2c - local_28 <= in_EDI) {
          local_14 = 0;
          for (local_1c = local_28; local_1c <= local_2c; local_1c = local_1c + 1) {
            *(int *)(in_RSI + (long)local_14 * 4) = local_1c;
            local_14 = local_14 + 1;
          }
        }
        local_4 = (local_2c - local_28) + 1;
      }
    }
  }
  return local_4;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_partition_place_nums(int place_nums_size,
                                                   int *place_nums) {
// copied from kmp_ftn_entry.h (but modified)
#if !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  if (!ompt_enabled.enabled || __kmp_get_gtid() < 0)
    return 0;

  int i, gtid, place_num, first_place, last_place, start, end;
  kmp_info_t *thread;
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  if (thread == NULL)
    return 0;
  first_place = thread->th.th_first_place;
  last_place = thread->th.th_last_place;
  if (first_place < 0 || last_place < 0)
    return 0;
  if (first_place <= last_place) {
    start = first_place;
    end = last_place;
  } else {
    start = last_place;
    end = first_place;
  }
  if (end - start <= place_nums_size)
    for (i = 0, place_num = start; place_num <= end; ++place_num, ++i) {
      place_nums[i] = place_num;
    }
  return end - start + 1;
#endif
}